

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

int NGA_Locate_nnodes(int g_a,int *lo,int *hi)

{
  long lVar1;
  long lVar2;
  Integer np;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_a0 [8];
  long lStack_60;
  Integer local_58 [8];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_60)[lVar2] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    if (0 < lVar1) {
      do {
        local_a0[lVar1] = (long)*hi + 1;
        hi = hi + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  pnga_locate_nnodes((long)g_a,local_58,local_a0 + 1,local_a0);
  return (int)local_a0[0];
}

Assistant:

int NGA_Locate_nnodes(int g_a, int lo[], int hi[])
{
     /* logical st; */
     Integer a=(Integer)g_a, np;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);
     /* st = wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np); */
     (void)wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np);
     return (int)np;
}